

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O2

Vec3 random_in_unit_disk_2(void)

{
  double dVar1;
  Vec3 *in_RDI;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  Vec3 VVar3;
  
  do {
    dVar2 = drand48();
    dVar1 = drand48();
    *(ulong *)in_RDI->e =
         CONCAT44((float)dVar1 + (float)dVar1 + -1.0,(float)dVar2 + (float)dVar2 + -1.0);
    in_RDI->e[2] = 0.0;
    VVar3.e[0] = dot(in_RDI,in_RDI);
  } while (1.0 <= VVar3.e[0]);
  VVar3.e[1] = (float)extraout_XMM0_Db;
  VVar3.e[2] = SUB84(dVar2,0);
  return (Vec3)VVar3.e;
}

Assistant:

Vec3
random_in_unit_disk_2(void)
{
    Vec3 _point;
    do {
        _point = 2.0f * Vec3(RANDOM_GEN(), RANDOM_GEN(), 0.0f) - Vec3(1.0f, 1.0f, 0.0f);

    } while (dot(_point,_point) >= 1.0f);

    return _point;
}